

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O2

int If_CutPerformCheck08(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  uint uVar2;
  ulong extraout_RDX;
  ulong uVar3;
  int v;
  int iVar4;
  int Supp;
  uint uVar5;
  word pF [16];
  
  if (nLeaves < 6) {
    return 1;
  }
  If_Dec08Copy(pF,(word *)pTruth,nVars);
  uVar5 = 0;
  uVar3 = extraout_RDX;
  for (iVar4 = 0; nLeaves != iVar4; iVar4 = iVar4 + 1) {
    iVar1 = If_Dec08HasVar(pF,nLeaves,iVar4);
    uVar2 = 1 << ((byte)iVar4 & 0x1f);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    uVar3 = (ulong)uVar2;
    uVar5 = uVar5 | uVar2;
  }
  iVar4 = 0;
  if ((uVar5 != 0) && (iVar4 = 0, (uVar5 + 1 & uVar5) == 0)) {
    iVar4 = If_Dec08Perform(pF,nLeaves,(int)uVar3);
  }
  return iVar4;
}

Assistant:

int If_CutPerformCheck08( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
	int nSupp, fDerive = 0;
    word pF[16];
    if ( nLeaves <= 5 )
        return 1;
    If_Dec08Copy( pF, (word *)pTruth, nVars );
    nSupp = If_Dec08Support( pF, nLeaves );
    if ( !nSupp || !If_DecSuppIsMinBase(nSupp) )
        return 0;
    if ( If_Dec08Perform( pF, nLeaves, fDerive ) )
    {
//        printf( "1" );
        return 1;
//        If_Dec08Verify( t, nLeaves, NULL );
    }
//    printf( "0" );
    return 0;
}